

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

xmlChar * xmlEscapePropValue(char *str)

{
  xmlChar xVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  xmlChar *pxVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  int utfLen;
  int local_44;
  xmlChar *local_40;
  xmlChar *local_38;
  
  sVar4 = strlen(str);
  lVar7 = sVar4 * 4 + 1;
  pxVar5 = (xmlChar *)(*_xmlMalloc)(lVar7);
  if (pxVar5 == (xmlChar *)0x0) {
    __fprintf_chk(_stderr,1,"memory allocation failure in %s\n","xmlEscapePropValue");
    exit(1);
  }
  local_40 = pxVar5 + lVar7;
  iVar2 = (int)str;
  local_44 = (int)pxVar5 + (int)sVar4 * 4 + 1;
  local_38 = pxVar5;
  while (*str != '\0') {
    utfLen = ((int)sVar4 + iVar2) - (int)str;
    uVar3 = xmlGetUTF8Char(str,&utfLen);
    iVar6 = (int)pxVar5;
    if (uVar3 == 0xffffffff) {
      xmlStrPrintf(pxVar5,(int)local_40 - iVar6,"\\x%.2x",*str);
      pxVar5 = pxVar5 + 4;
      str = (char *)((xmlChar *)str + 1);
    }
    else if ((((uVar3 < 0x80 && 1 < utfLen) || (uVar3 < 0x800 && 2 < utfLen)) ||
             (uVar3 < 0x10000 && 3 < utfLen)) || (4 < utfLen && uVar3 < 0x110000)) {
      iVar6 = local_44 - iVar6;
      for (lVar7 = 0; (int)lVar7 < utfLen; lVar7 = lVar7 + 1) {
        xmlStrPrintf(pxVar5,iVar6,"\\x%.2x",((xmlChar *)str)[lVar7]);
        pxVar5 = pxVar5 + 4;
        iVar6 = iVar6 + -4;
      }
      str = (char *)((xmlChar *)str + lVar7);
    }
    else if (((uVar3 < 0xe) && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)) ||
            ((((uVar3 & 0xfff8fffe) - 0x80000 < 0xfffe || (uVar3 & 0xfffcfffe) - 0x40000 < 0xfffe)
             || (((uVar3 & 0xfffefffe) - 0x20000 < 0xfffe ||
                 (uVar3 - 0x10000 < 0xfffe || uVar3 - 0xfdf0 < 0x20e)) ||
                ((uVar3 - 0xe000 < 0x1dd0 || uVar3 == 0x85) ||
                (uVar3 - 0xa0 < 0xd760 || uVar3 - 0x20 < 0x5f)))) || uVar3 - 0x100000 < 0xfffe)) {
      while (bVar8 = utfLen != 0, utfLen = utfLen + -1, bVar8) {
        xVar1 = *str;
        str = (char *)((xmlChar *)str + 1);
        *pxVar5 = xVar1;
        pxVar5 = pxVar5 + 1;
      }
    }
    else {
      xmlStrPrintf(pxVar5,(int)local_40 - iVar6,"&x%x;",uVar3);
    }
  }
  *pxVar5 = '\0';
  return local_38;
}

Assistant:

static xmlChar* xmlEscapePropValue(const char *str) {
    size_t len = strlen(str);
    /*
     * The worst-case length of the output is 4 times the input length (if
     * every input byte has to be escaped) plus 1 for the terminating NUL
     * character
     */
    size_t retLen = len * 4 + 1;
    xmlChar* ret = xmlMalloc(retLen), *retPos = ret, *retEnd = ret + retLen;
    if (!ret) {
        fprintf(stderr, "memory allocation failure in %s\n", __func__);
        exit(EXIT_FAILURE);
    }

    const unsigned char *it = (const unsigned char*)str;
    const unsigned char *itEnd = it + len;
    while (*it) {
        int utfLen = itEnd - it;
        int ucs = xmlGetUTF8Char(it, &utfLen);
        if (ucs != -1) {
            if (!isOverlongUTF8(ucs, utfLen)) {
                if (isNonRestrictedXMLChar(ucs)) {
                    /* Valid UTF8 sequence of an allowed character */
                    while (utfLen--)
                        *retPos++ = *it++;
                } else {
                    xmlStrPrintf(retPos, retEnd - retPos, "&x%x;", ucs);
                }
            } else {
                /* Disallowed character or overlong UTF8, escape entire sequence */
                for(int i = 0;i < utfLen;++i) {
                    xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
                    retPos += 4;
                    ++it;
                }
            }
        } else {
            /* Invalid UTF8, escape one byte then try to parse rest of input as UTF8 again */
            xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
            retPos += 4;
            ++it;
        }
    }

    *retPos = '\0';
    return ret;
}